

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

PyObject * __thiscall
pybind11::cpp_function::dispatcher
          (cpp_function *this,PyObject *self,PyObject *args_in,PyObject *kwargs_in)

{
  uint __val;
  ushort uVar1;
  PyTypeObject *pPVar2;
  bool bVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  pointer phVar7;
  pointer *pphVar8;
  byte bVar9;
  int iVar10;
  uint uVar11;
  type_info *find_type;
  undefined8 extraout_RAX;
  internals *piVar12;
  handle hVar13;
  undefined8 *puVar14;
  long *plVar15;
  long lVar16;
  function_call *pfVar17;
  function_call *pfVar18;
  function_record *pfVar19;
  object *poVar20;
  ulong uVar21;
  instance *piVar22;
  ulong uVar23;
  uint uVar24;
  PyObject *tmp;
  uint __uval;
  ulong uVar25;
  uint __len;
  ulong uVar26;
  function_call *pfVar27;
  handle hVar28;
  instance *piVar29;
  function_record *pfVar30;
  bool bVar31;
  handle arg;
  vector<bool,_std::allocator<bool>_> second_pass_convert;
  function_call call;
  dict kwargs_1;
  dict kwargs;
  vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
  second_pass;
  instance *pi;
  undefined1 local_1e8 [24];
  object oStack_1d0;
  pointer local_1c8;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  pointer local_198;
  function_call *local_188;
  function_call *local_180;
  undefined4 local_174;
  undefined1 local_170 [8];
  undefined1 auStack_168 [16];
  handle hStack_158;
  anon_union_24_2_63b86169_for_instance_1 local_150;
  handle hStack_138;
  pointer local_130;
  object oStack_128;
  object local_120;
  handle local_118;
  handle local_110;
  instance *local_108;
  handle local_100;
  handle local_f8;
  long local_f0;
  PyObject local_e8;
  undefined1 local_d8 [32];
  PyTypeObject *local_b8;
  uint local_ac;
  ulong local_a8;
  ulong local_a0;
  PyObject *local_98;
  value_and_holder local_88;
  ulong local_60;
  object local_58;
  pointer *local_50;
  handle local_48;
  object local_40;
  object local_38;
  
  local_108 = (instance *)PyCapsule_GetPointer(this,0);
  if ((self->ob_type->tp_flags & 0x4000000) == 0) {
    __assert_fail("PyTuple_Check(args_in)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/marcusvaltonen[P]python-droneposelib/lib/pybind11/include/pybind11/pybind11.h"
                  ,0x227,
                  "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                 );
  }
  uVar23 = self[1].ob_refcnt;
  if (uVar23 == 0) {
    local_b8 = (PyTypeObject *)0x0;
  }
  else {
    local_b8 = self[1].ob_type;
  }
  local_88.type = (type_info *)0x0;
  local_88.vh = (void **)0x0;
  local_88.inst = (instance *)0x0;
  local_88.index = 0;
  local_188 = (function_call *)self;
  if ((*(byte *)((long)&local_108[1].field_1 + 0x11) & 1) != 0) {
    if (((local_b8->ob_base).ob_base.ob_type != (PyTypeObject *)local_108[2].ob_base.ob_refcnt) &&
       (iVar10 = PyType_IsSubtype(), iVar10 == 0)) {
      PyErr_SetString(_PyExc_TypeError,"__init__(self, ...) called with invalid `self` argument");
      return (PyObject *)0x0;
    }
    find_type = detail::get_type_info((PyTypeObject *)local_108[2].ob_base.ob_refcnt);
    detail::instance::get_value_and_holder
              ((value_and_holder *)local_170,(instance *)local_b8,find_type,true);
    local_88.type = (type_info *)auStack_168._8_8_;
    local_88.vh = (void **)hStack_158.m_ptr;
    local_88.inst = (instance *)local_170;
    local_88.index = auStack_168._0_8_;
    bVar9 = (byte)((PyObject *)((long)local_170 + 0x30))->ob_refcnt;
    if ((bVar9 & 2) == 0) {
      bVar9 = *(byte *)((long)&(((PyObject *)((long)local_170 + 0x10))->ob_type->ob_base).ob_base.
                               ob_refcnt + (long)&((PyObject *)auStack_168._0_8_)->ob_refcnt) & 2;
      kwargs_in = (PyObject *)auStack_168._0_8_;
    }
    else {
      bVar9 = bVar9 >> 3 & 1;
      kwargs_in = (PyObject *)local_170;
    }
    if (bVar9 != 0) {
      __Py_NoneStruct = __Py_NoneStruct + 1;
      local_170 = (undefined1  [8])0x0;
      object::~object((object *)local_170);
      return (PyObject *)&_Py_NoneStruct;
    }
  }
  local_d8._0_8_ = (PyObject *)0x0;
  local_d8._8_8_ = (function_call *)0x0;
  local_d8._16_8_ = (pointer)0x0;
  local_180 = (function_call *)args_in;
  if (local_108 == (instance *)0x0) {
    local_174 = 0;
    hVar13.m_ptr = (PyObject *)0x1;
  }
  else {
    local_174 = (undefined4)
                CONCAT71((int7)((ulong)kwargs_in >> 8),
                         local_108[2].field_1.nonsimple.values_and_holders != (void **)0x0);
    local_50 = (pointer *)
               ((long)&(local_188->args).
                       super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>.
                       _M_impl.super__Vector_impl_data + 0x10);
    local_98 = (PyObject *)0x1;
    hVar28.m_ptr = &local_108->ob_base;
    local_a8 = uVar23;
    do {
      uVar1 = *(ushort *)((long)&hVar28.m_ptr[5].ob_type + 1);
      uVar24 = (uVar1 & 0x20) >> 5;
      local_60 = (long)(short)((uint)(int)(short)(uVar1 << 9) >> 0xf) +
                 ((ulong)*(ushort *)((long)&hVar28.m_ptr[5].ob_type + 4) - (ulong)uVar24);
      uVar21 = local_60 - *(ushort *)((long)&hVar28.m_ptr[5].ob_type + 6);
      if (((uVar24 == 0) && (uVar21 < uVar23)) ||
         ((local_a0 = uVar21, uVar23 < uVar21 &&
          ((ulong)(hVar28.m_ptr[2].ob_refcnt - (long)hVar28.m_ptr[1].ob_type >> 5) < uVar21)))) {
        bVar31 = false;
      }
      else {
        local_150.simple_value_holder[2] = (function_call *)0x0;
        hStack_138.m_ptr = hStack_138.m_ptr & 0xffffffff00000000;
        local_150.simple_value_holder[1] =
             (void *)((ulong)local_150.simple_value_holder[1] & 0xffffffff00000000);
        hStack_158.m_ptr = (PyObject *)0x0;
        local_150.simple_value_holder[0] = (function_call *)0x0;
        auStack_168._0_8_ = (instance *)0x0;
        auStack_168._8_8_ = (PyObject *)0x0;
        local_120.super_handle.m_ptr = (handle)(PyObject *)0x0;
        local_130 = (pointer)0x0;
        oStack_128.super_handle.m_ptr = (handle)(PyObject *)0x0;
        local_118.m_ptr = (PyObject *)local_b8;
        local_110.m_ptr = (PyObject *)0x0;
        local_170 = (undefined1  [8])hVar28.m_ptr;
        std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::reserve
                  ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)auStack_168,
                   (ulong)*(ushort *)((long)&hVar28.m_ptr[5].ob_type + 4));
        std::vector<bool,_std::allocator<bool>_>::reserve
                  ((vector<bool,_std::allocator<bool>_> *)&local_150.nonsimple,
                   (ulong)*(ushort *)((long)&hVar28.m_ptr[5].ob_type + 4));
        uVar21 = local_a0;
        if (uVar23 < local_a0) {
          uVar21 = uVar23;
        }
        if (((ulong)hVar28.m_ptr[5].ob_type & 0x200) == 0) {
          uVar26 = 0;
        }
        else {
          if (*(PyObject **)local_88.vh != (PyObject *)0x0) {
            (*(local_88.type)->dealloc)(&local_88);
          }
          if ((((PyTypeObject *)
               (local_188->args).
               super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>._M_impl.
               super__Vector_impl_data._M_start)->tp_flags & 0x4000000) == 0) {
            __assert_fail("PyTuple_Check(args_in)",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/marcusvaltonen[P]python-droneposelib/lib/pybind11/include/pybind11/pybind11.h"
                          ,0x274,
                          "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                         );
          }
          local_110.m_ptr =
               *(PyObject **)
                ((long)&(local_188->args).
                        super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>.
                        _M_impl.super__Vector_impl_data + 0x10);
          local_1e8._0_8_ = &local_88;
          if ((PyObject *)auStack_168._8_8_ == hStack_158.m_ptr) {
            std::vector<pybind11::handle,std::allocator<pybind11::handle>>::
            _M_realloc_insert<_object*>
                      ((vector<pybind11::handle,std::allocator<pybind11::handle>> *)auStack_168,
                       (iterator)auStack_168._8_8_,(_object **)local_1e8);
          }
          else {
            *(PyObject **)auStack_168._8_8_ = (PyObject *)local_1e8._0_8_;
            auStack_168._8_8_ = auStack_168._8_8_ + 8;
          }
          uVar26 = 1;
          std::vector<bool,_std::allocator<bool>_>::push_back
                    ((vector<bool,_std::allocator<bool>_> *)&local_150.nonsimple,false);
        }
        if (uVar26 < uVar21) {
          uVar25 = (ulong)(uint)((int)uVar26 << 5);
          bVar31 = false;
          do {
            plVar15 = (long *)((long)&((hVar28.m_ptr[1].ob_type)->ob_base).ob_base.ob_refcnt +
                              uVar25);
            if ((ulong)(hVar28.m_ptr[2].ob_refcnt - (long)hVar28.m_ptr[1].ob_type >> 5) <= uVar26) {
              plVar15 = (long *)0x0;
            }
            if ((((local_180 == (function_call *)0x0) || (plVar15 == (long *)0x0)) ||
                (*plVar15 == 0)) || (lVar16 = PyDict_GetItemString(local_180), lVar16 == 0)) {
              if ((((PyTypeObject *)
                   (local_188->args).
                   super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>._M_impl.
                   super__Vector_impl_data._M_start)->tp_flags & 0x4000000) == 0) {
                __assert_fail("PyTuple_Check(args_in)",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/marcusvaltonen[P]python-droneposelib/lib/pybind11/include/pybind11/pybind11.h"
                              ,0x283,
                              "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                             );
              }
              local_1e8._0_8_ =
                   *(undefined8 *)
                    ((long)&(local_188->args).
                            super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>.
                            _M_impl.super__Vector_impl_data + uVar26 * 8 + 0x10);
              if (((plVar15 == (long *)0x0) || ((*(byte *)(plVar15 + 3) & 2) != 0)) ||
                 ((function_call *)local_1e8._0_8_ != (function_call *)&_Py_NoneStruct)) {
                if ((PyObject *)auStack_168._8_8_ == hStack_158.m_ptr) {
                  std::vector<pybind11::handle,std::allocator<pybind11::handle>>::
                  _M_realloc_insert<pybind11::handle_const&>
                            ((vector<pybind11::handle,std::allocator<pybind11::handle>> *)
                             auStack_168,(iterator)auStack_168._8_8_,(handle *)local_1e8);
                }
                else {
                  *(PyObject **)auStack_168._8_8_ = (PyObject *)local_1e8._0_8_;
                  auStack_168._8_8_ = auStack_168._8_8_ + 8;
                }
                bVar3 = true;
                bVar9 = 1;
                if (plVar15 != (long *)0x0) {
                  bVar9 = *(byte *)(plVar15 + 3);
                }
                std::vector<bool,_std::allocator<bool>_>::push_back
                          ((vector<bool,_std::allocator<bool>_> *)&local_150.nonsimple,
                           (bool)(bVar9 & 1));
              }
              else {
                bVar3 = false;
                bVar31 = true;
              }
            }
            else {
              bVar31 = true;
              bVar3 = false;
            }
            uVar23 = local_a8;
            if (!bVar3) break;
            uVar26 = uVar26 + 1;
            uVar25 = uVar25 + 0x20;
          } while (uVar21 != uVar26);
        }
        else {
          bVar31 = false;
        }
        if (bVar31) {
          bVar31 = false;
        }
        else {
          local_f8.m_ptr = (PyObject *)local_180;
          if (local_180 != (function_call *)0x0) {
            ((PyObject *)&local_180->func)->ob_refcnt =
                 ((PyObject *)&local_180->func)->ob_refcnt + 1;
          }
          if (uVar26 < (ushort)hVar28.m_ptr[6].ob_refcnt) {
            if (uVar26 < (ushort)hVar28.m_ptr[6].ob_refcnt) {
              uVar25 = uVar26 << 5 | 0x10;
              do {
                pPVar2 = hVar28.m_ptr[1].ob_type;
                local_1e8._0_8_ = (function_call *)0x0;
                if (*(long *)((long)&(pPVar2->ob_base).ob_base.ob_refcnt + uVar25) != 0) {
                  local_1e8._0_8_ =
                       *(undefined8 *)((long)&(pPVar2->ob_base).ob_base.ob_refcnt + uVar25);
                }
                uVar4 = local_1e8._0_8_;
                if ((function_call *)local_1e8._0_8_ == (function_call *)0x0) break;
                if ((PyObject *)auStack_168._8_8_ == hStack_158.m_ptr) {
                  std::vector<pybind11::handle,std::allocator<pybind11::handle>>::
                  _M_realloc_insert<pybind11::handle_const&>
                            ((vector<pybind11::handle,std::allocator<pybind11::handle>> *)
                             auStack_168,(iterator)auStack_168._8_8_,(handle *)local_1e8);
                }
                else {
                  *(PyObject **)auStack_168._8_8_ = (PyObject *)local_1e8._0_8_;
                  auStack_168._8_8_ = auStack_168._8_8_ + 8;
                }
                std::vector<bool,_std::allocator<bool>_>::push_back
                          ((vector<bool,_std::allocator<bool>_> *)&local_150.nonsimple,
                           (bool)(*(byte *)((long)&(pPVar2->ob_base).ob_base.ob_type + uVar25) & 1))
                ;
                if ((function_call *)uVar4 == (function_call *)0x0) break;
                uVar26 = uVar26 + 1;
                uVar25 = uVar25 + 0x20;
              } while (uVar26 < (ushort)hVar28.m_ptr[6].ob_refcnt);
            }
            if ((ushort)hVar28.m_ptr[6].ob_refcnt <= uVar26) goto LAB_0010e286;
LAB_0010e422:
            bVar31 = false;
          }
          else {
LAB_0010e286:
            if (uVar26 < local_60) {
              uVar23 = uVar26 << 5 | 0x18;
              bVar31 = true;
              local_ac = 0;
              do {
                pPVar2 = hVar28.m_ptr[1].ob_type;
                local_1e8._0_8_ = (function_call *)0x0;
                if ((local_180 != (function_call *)0x0) &&
                   (*(long *)((long)pPVar2 + (uVar23 - 0x18)) != 0)) {
                  local_1e8._0_8_ = PyDict_GetItemString(local_f8.m_ptr);
                }
                if ((function_call *)local_1e8._0_8_ == (function_call *)0x0) {
                  if (*(long *)((long)pPVar2 + (uVar23 - 8)) != 0) {
                    local_1e8._0_8_ = *(undefined8 *)((long)pPVar2 + (uVar23 - 8));
                  }
                }
                else {
                  if ((local_ac & 1) == 0) {
                    local_1b8._0_8_ = PyDict_Copy(local_f8.m_ptr);
                    object::operator=((object *)&local_f8,(object *)local_1b8);
                    object::~object((object *)local_1b8);
                    local_ac = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
                  }
                  PyDict_DelItemString(local_f8.m_ptr);
                }
                if (((function_call *)local_1e8._0_8_ != (function_call *)0x0 &
                    ((function_call *)local_1e8._0_8_ != (function_call *)&_Py_NoneStruct |
                    *(byte *)((long)&(pPVar2->ob_base).ob_base.ob_refcnt + uVar23) >> 1)) != 1) {
                  if (bVar31) {
                    bVar31 = false;
                    uVar23 = local_a8;
                    goto LAB_0010e8bf;
                  }
                  break;
                }
                if ((PyObject *)auStack_168._8_8_ == hStack_158.m_ptr) {
                  std::vector<pybind11::handle,std::allocator<pybind11::handle>>::
                  _M_realloc_insert<pybind11::handle_const&>
                            ((vector<pybind11::handle,std::allocator<pybind11::handle>> *)
                             auStack_168,(iterator)auStack_168._8_8_,(handle *)local_1e8);
                }
                else {
                  *(PyObject **)auStack_168._8_8_ = (PyObject *)local_1e8._0_8_;
                  auStack_168._8_8_ = auStack_168._8_8_ + 8;
                }
                std::vector<bool,_std::allocator<bool>_>::push_back
                          ((vector<bool,_std::allocator<bool>_> *)&local_150.nonsimple,
                           (bool)(*(byte *)((long)&(pPVar2->ob_base).ob_base.ob_refcnt + uVar23) & 1
                                 ));
                uVar26 = uVar26 + 1;
                uVar23 = uVar23 + 0x20;
                bVar31 = uVar26 < local_60;
              } while (bVar31);
            }
            uVar23 = local_a8;
            if ((((function_call *)local_f8.m_ptr != (function_call *)0x0) &&
                (lVar16 = PyDict_Size(), lVar16 != 0)) &&
               (((ulong)hVar28.m_ptr[5].ob_type & 0x4000) == 0)) goto LAB_0010e422;
            if (((ulong)hVar28.m_ptr[5].ob_type & 0x2000) != 0) {
              tuple::tuple((tuple *)local_1b8,0);
              if (uVar21 == 0) {
                local_1e8._0_8_ = local_188;
                if (local_188 != (function_call *)0x0) {
                  ((PyObject *)&local_188->func)->ob_refcnt =
                       ((PyObject *)&local_188->func)->ob_refcnt + 1;
                }
LAB_0010e514:
                object::operator=((object *)local_1b8,(object *)local_1e8);
                object::~object((object *)local_1e8);
              }
              else {
                pfVar27 = (function_call *)(uVar23 - uVar26);
                if (uVar23 < uVar26 || pfVar27 == (function_call *)0x0) {
                  tuple::tuple((tuple *)local_1e8,0);
                  goto LAB_0010e514;
                }
                tuple::tuple((tuple *)local_1e8,(size_t)pfVar27);
                object::operator=((object *)local_1b8,(object *)local_1e8);
                object::~object((object *)local_1e8);
                pphVar8 = local_50;
                if (uVar23 != uVar26) {
                  pfVar17 = (function_call *)0x0;
                  do {
                    if ((((PyTypeObject *)
                         (local_188->args).
                         super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>.
                         _M_impl.super__Vector_impl_data._M_start)->tp_flags & 0x4000000) == 0) {
                      __assert_fail("PyTuple_Check(args_in)",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/marcusvaltonen[P]python-droneposelib/lib/pybind11/include/pybind11/pybind11.h"
                                    ,0x2dc,
                                    "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                                   );
                    }
                    local_1e8._8_8_ = local_1b8._0_8_;
                    oStack_1d0.super_handle.m_ptr = (handle)(PyObject *)0x0;
                    local_1e8._16_8_ = pfVar17;
                    detail::accessor_policies::tuple_item::set
                              ((handle)local_1b8._0_8_,(size_t)pfVar17,
                               (PyObject *)
                               pphVar8[(long)((long)&((PyObject *)&pfVar17->func)->ob_refcnt +
                                             uVar26)]);
                    object::~object((object *)(local_1e8 + 0x18));
                    pfVar17 = (function_call *)((long)&((PyObject *)&pfVar17->func)->ob_refcnt + 1);
                  } while (pfVar27 != pfVar17);
                }
              }
              if ((PyObject *)auStack_168._8_8_ == hStack_158.m_ptr) {
                std::vector<pybind11::handle,std::allocator<pybind11::handle>>::
                _M_realloc_insert<pybind11::handle_const&>
                          ((vector<pybind11::handle,std::allocator<pybind11::handle>> *)auStack_168,
                           (iterator)auStack_168._8_8_,(handle *)local_1b8);
              }
              else {
                *(PyObject **)auStack_168._8_8_ = (PyObject *)local_1b8._0_8_;
                auStack_168._8_8_ = auStack_168._8_8_ + 8;
              }
              std::vector<bool,_std::allocator<bool>_>::push_back
                        ((vector<bool,_std::allocator<bool>_> *)&local_150.nonsimple,false);
              object::operator=(&oStack_128,(object *)local_1b8);
              object::~object((object *)local_1b8);
            }
            if (((ulong)hVar28.m_ptr[5].ob_type & 0x4000) != 0) {
              if ((function_call *)local_f8.m_ptr == (function_call *)0x0) {
                dict::dict((dict *)local_1e8);
                object::operator=((object *)&local_f8,(object *)local_1e8);
                object::~object((object *)local_1e8);
              }
              if ((PyObject *)auStack_168._8_8_ == hStack_158.m_ptr) {
                std::vector<pybind11::handle,std::allocator<pybind11::handle>>::
                _M_realloc_insert<pybind11::handle_const&>
                          ((vector<pybind11::handle,std::allocator<pybind11::handle>> *)auStack_168,
                           (iterator)auStack_168._8_8_,&local_f8);
              }
              else {
                *(PyObject **)auStack_168._8_8_ = local_f8.m_ptr;
                auStack_168._8_8_ = auStack_168._8_8_ + 8;
              }
              std::vector<bool,_std::allocator<bool>_>::push_back
                        ((vector<bool,_std::allocator<bool>_> *)&local_150.nonsimple,false);
              object::operator=(&local_120,(object *)&local_f8);
            }
            uVar21 = (ulong)*(ushort *)((long)&hVar28.m_ptr[5].ob_type + 4);
            if (((long)(auStack_168._8_8_ - auStack_168._0_8_) >> 3 != uVar21) ||
               (((ulong)hStack_138.m_ptr & 0xffffffff) +
                ((long)local_150.simple_value_holder[2] - local_150._0_8_) * 8 != uVar21)) {
              pybind11_fail(
                           "Internal error: function call dispatcher inserted wrong number of arguments!"
                           );
            }
            local_1b8._0_8_ = (PyObject *)0x0;
            local_1b8._8_8_ = local_1b8._8_8_ & 0xffffffff00000000;
            local_1a8._0_8_ = (function_record *)0x0;
            local_1a8._8_8_ = local_1a8._8_8_ & 0xffffffff00000000;
            local_198 = (pointer)0x0;
            if ((byte)local_174 != '\0') {
              std::vector<bool,_std::allocator<bool>_>::resize
                        ((vector<bool,_std::allocator<bool>_> *)local_1b8,uVar21,false);
              phVar7 = local_130;
              hVar13.m_ptr = hStack_138.m_ptr;
              uVar6 = local_150.simple_value_holder[2];
              uVar5 = local_150.simple_value_holder[1];
              uVar4 = local_150.simple_value_holder[0];
              local_1c8 = local_130;
              local_1e8._16_8_ = local_150.simple_value_holder[2];
              oStack_1d0.super_handle.m_ptr = (handle)(handle)hStack_138.m_ptr;
              local_1e8._0_8_ = local_150.simple_value_holder[0];
              local_1e8._8_8_ = local_150.simple_value_holder[1];
              local_130 = local_198;
              local_150.simple_value_holder[2] = (void *)local_1a8._0_8_;
              hStack_138.m_ptr = (PyObject *)local_1a8._8_8_;
              local_150.simple_value_holder[0] = (void *)local_1b8._0_8_;
              local_150.simple_value_holder[1] = (void *)local_1b8._8_8_;
              local_1b8._0_8_ = uVar4;
              local_1b8._8_8_ = uVar5;
              local_1a8._0_8_ = uVar6;
              local_1a8._8_8_ = hVar13.m_ptr;
              local_198 = phVar7;
            }
            piVar12 = detail::get_internals();
            local_40.super_handle.m_ptr = (handle)(PyObject *)0x0;
            std::vector<_object*,std::allocator<_object*>>::emplace_back<_object*>
                      ((vector<_object*,std::allocator<_object*>> *)&piVar12->loader_patient_stack,
                       (_object **)&local_40);
            local_98 = (PyObject *)(*(code *)hVar28.m_ptr[3].ob_refcnt)(local_170);
            detail::loader_life_support::~loader_life_support((loader_life_support *)local_1e8);
            phVar7 = local_130;
            hVar13.m_ptr = hStack_138.m_ptr;
            uVar6 = local_150.simple_value_holder[2];
            uVar5 = local_150.simple_value_holder[1];
            uVar4 = local_150.simple_value_holder[0];
            bVar31 = local_98 != (PyObject *)0x1;
            if (((byte)local_174 & local_98 == (PyObject *)0x1) != 0) {
              bVar31 = false;
              for (uVar21 = (ulong)(*(ushort *)((long)&hVar28.m_ptr[5].ob_type + 1) >> 4 & 1);
                  uVar21 < local_a0; uVar21 = uVar21 + 1) {
                uVar26 = uVar21 + 0x3f;
                if (-1 < (long)uVar21) {
                  uVar26 = uVar21;
                }
                if ((*(ulong *)(local_1b8._0_8_ +
                               (ulong)((uVar21 & 0x800000000000003f) < 0x8000000000000001) * 8 +
                               ((long)uVar26 >> 6) * 8 + -8) >> (uVar21 & 0x3f) & 1) != 0) {
                  local_1c8 = local_130;
                  local_1e8._16_8_ = local_150.simple_value_holder[2];
                  oStack_1d0.super_handle.m_ptr = (handle)(handle)hStack_138.m_ptr;
                  local_1e8._0_8_ = local_150.simple_value_holder[0];
                  local_1e8._8_8_ = local_150.simple_value_holder[1];
                  bVar31 = false;
                  local_130 = local_198;
                  local_150.simple_value_holder[2] = (void *)local_1a8._0_8_;
                  hStack_138.m_ptr = (PyObject *)local_1a8._8_8_;
                  local_150.simple_value_holder[0] = (void *)local_1b8._0_8_;
                  local_150.simple_value_holder[1] = (void *)local_1b8._8_8_;
                  local_1b8._0_8_ = uVar4;
                  local_1b8._8_8_ = uVar5;
                  local_1a8._0_8_ = uVar6;
                  local_1a8._8_8_ = hVar13.m_ptr;
                  local_198 = phVar7;
                  std::
                  vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
                  ::emplace_back<pybind11::detail::function_call>
                            ((vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
                              *)local_d8,(function_call *)local_170);
                  break;
                }
              }
            }
            if ((PyObject *)local_1b8._0_8_ != (PyObject *)0x0) {
              operator_delete((void *)local_1b8._0_8_,(long)local_198 - local_1b8._0_8_);
              local_1b8._0_8_ = (PyObject *)0x0;
              local_1b8._8_8_ = local_1b8._8_8_ & 0xffffffff00000000;
              local_1a8._0_8_ = (function_record *)0x0;
              local_1a8._8_8_ = local_1a8._8_8_ & 0xffffffff00000000;
              local_198 = (pointer)0x0;
            }
          }
LAB_0010e8bf:
          object::~object((object *)&local_f8);
        }
        object::~object(&local_120);
        object::~object(&oStack_128);
        if ((function_call *)local_150.simple_value_holder[0] != (function_call *)0x0) {
          operator_delete(local_150.simple_value_holder[0],(long)local_130 - local_150._0_8_);
          local_150.simple_value_holder[0] = (function_call *)0x0;
          local_150.simple_value_holder[1] =
               (void *)((ulong)local_150.simple_value_holder[1] & 0xffffffff00000000);
          local_150.simple_value_holder[2] = (function_call *)0x0;
          hStack_138.m_ptr = hStack_138.m_ptr & 0xffffffff00000000;
          local_130 = (pointer)0x0;
        }
        if ((instance *)auStack_168._0_8_ != (instance *)0x0) {
          operator_delete((void *)auStack_168._0_8_,(long)hStack_158.m_ptr - auStack_168._0_8_);
        }
      }
      hVar13.m_ptr = local_98;
    } while ((!bVar31) &&
            (hVar28.m_ptr = (PyObject *)hVar28.m_ptr[8].ob_refcnt,
            (instance *)hVar28.m_ptr != (instance *)0x0));
  }
  uVar4 = local_d8._8_8_;
  if (((byte)local_174 != '\0') &&
     ((local_d8._0_8_ != local_d8._8_8_ && (hVar13.m_ptr == (PyObject *)0x1)))) {
    pfVar27 = (function_call *)local_d8._0_8_;
    do {
      piVar12 = detail::get_internals();
      local_38.super_handle.m_ptr = (handle)(PyObject *)0x0;
      std::vector<_object*,std::allocator<_object*>>::emplace_back<_object*>
                ((vector<_object*,std::allocator<_object*>> *)&piVar12->loader_patient_stack,
                 (_object **)&local_38);
      hVar13 = (*pfVar27->func->impl)(pfVar27);
      detail::loader_life_support::~loader_life_support((loader_life_support *)local_170);
      if (hVar13.m_ptr != (PyObject *)0x1) break;
      pfVar27 = pfVar27 + 1;
    } while (pfVar27 != (function_call *)uVar4);
  }
  std::vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>::
  ~vector((vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
           *)local_d8);
  piVar29 = local_108;
  if (hVar13.m_ptr == (PyObject *)0x0) {
    local_170 = (undefined1  [8])(auStack_168 + 8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_170,
               "Unable to convert function return value to a Python type! The signature was\n\t","")
    ;
    std::__cxx11::string::append(local_170);
    lVar16 = std::__cxx11::string::find(local_170,0x182f96,0);
    if (lVar16 != -1) {
      std::__cxx11::string::append(local_170);
    }
    PyErr_SetString(_PyExc_TypeError,local_170);
    if (local_170 == (undefined1  [8])(auStack_168 + 8)) {
      return (PyObject *)0x0;
    }
    goto LAB_0010f649;
  }
  if (hVar13.m_ptr != (PyObject *)0x1) {
    if ((*(byte *)((long)&local_108[1].field_1 + 0x11) & 1) == 0) {
      return hVar13.m_ptr;
    }
    if (((local_88.inst)->field_0x30 & 2) == 0) {
      bVar9 = *(byte *)((long)&((PyObject *)local_88.index)->ob_refcnt +
                       *(long *)&(((vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                                    *)((long)local_88.inst + 0x18))->
                                 super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                                 )._M_impl.super__Vector_impl_data);
    }
    else {
      bVar9 = (byte)(local_88.inst)->field_0x30 >> 2;
    }
    if ((bVar9 & 1) == 0) {
      (*(local_88.type)->init_instance)((instance *)local_b8,(void *)0x0);
      return hVar13.m_ptr;
    }
    return hVar13.m_ptr;
  }
  if ((*(byte *)((long)&local_108[1].field_1 + 0x11) & 8) != 0) {
    __Py_NotImplementedStruct = __Py_NotImplementedStruct + 1;
    return (PyObject *)&_Py_NotImplementedStruct;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_d8,(char *)(local_108->ob_base).ob_refcnt,(allocator<char> *)&local_100
            );
  puVar14 = (undefined8 *)std::__cxx11::string::append(local_d8);
  pfVar27 = (function_call *)(puVar14 + 2);
  if ((function_call *)*puVar14 == pfVar27) {
    local_1a8._0_8_ = ((PyObject *)&pfVar27->func)->ob_refcnt;
    local_1a8._8_8_ = puVar14[3];
    local_1b8._0_8_ = (PyObject *)local_1a8;
  }
  else {
    local_1a8._0_8_ = ((PyObject *)&pfVar27->func)->ob_refcnt;
    local_1b8._0_8_ = (PyObject *)*puVar14;
  }
  local_1b8._8_8_ = puVar14[1];
  *puVar14 = pfVar27;
  puVar14[1] = 0;
  *(undefined1 *)(puVar14 + 2) = 0;
  uVar1 = *(ushort *)((long)&piVar29[1].field_1 + 0x11);
  iVar10 = 0x182d23;
  if ((uVar1 & 1) != 0) {
    iVar10 = 0x182d17;
  }
  local_f8.m_ptr = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f8,iVar10,iVar10 + (uVar1 & 1) * 3 + 8);
  pfVar30 = (function_record *)((long)&((PyObject *)local_1b8._8_8_)->ob_refcnt + local_f0);
  pfVar19 = (function_record *)0xf;
  if ((PyObject *)local_1b8._0_8_ != (PyObject *)local_1a8) {
    pfVar19 = (function_record *)local_1a8._0_8_;
  }
  if (pfVar19 < pfVar30) {
    pfVar19 = (function_record *)0xf;
    if (local_f8.m_ptr != &local_e8) {
      pfVar19 = (function_record *)local_e8.ob_refcnt;
    }
    if (pfVar19 < pfVar30) goto LAB_0010ecd6;
    puVar14 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,local_1b8._0_8_);
  }
  else {
LAB_0010ecd6:
    puVar14 = (undefined8 *)std::__cxx11::string::_M_append(local_1b8,(ulong)local_f8.m_ptr);
  }
  local_1e8._0_8_ = local_1e8 + 0x10;
  pfVar27 = (function_call *)(puVar14 + 2);
  if ((function_call *)*puVar14 == pfVar27) {
    local_1e8._16_8_ = ((PyObject *)&pfVar27->func)->ob_refcnt;
    oStack_1d0.super_handle.m_ptr = (handle)puVar14[3];
  }
  else {
    local_1e8._16_8_ = ((PyObject *)&pfVar27->func)->ob_refcnt;
    local_1e8._0_8_ = (function_call *)*puVar14;
  }
  local_1e8._8_8_ = puVar14[1];
  *puVar14 = pfVar27;
  puVar14[1] = 0;
  *(undefined1 *)&((PyObject *)&pfVar27->func)->ob_refcnt = 0;
  plVar15 = (long *)std::__cxx11::string::append(local_1e8);
  local_170 = (undefined1  [8])(auStack_168 + 8);
  piVar22 = (instance *)(plVar15 + 2);
  if ((instance *)*plVar15 == piVar22) {
    auStack_168._8_8_ = (piVar22->ob_base).ob_refcnt;
    hStack_158.m_ptr = (PyObject *)plVar15[3];
  }
  else {
    auStack_168._8_8_ = (piVar22->ob_base).ob_refcnt;
    local_170 = (undefined1  [8])*plVar15;
  }
  auStack_168._0_8_ = plVar15[1];
  *plVar15 = (long)piVar22;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  if ((function_call *)local_1e8._0_8_ != (function_call *)(local_1e8 + 0x10)) {
    operator_delete((void *)local_1e8._0_8_,(ulong)(local_1e8._16_8_ + 1));
  }
  if (local_f8.m_ptr != &local_e8) {
    operator_delete(local_f8.m_ptr,(ulong)((long)&((PyObject *)local_e8.ob_refcnt)->ob_refcnt + 1));
  }
  if ((PyObject *)local_1b8._0_8_ != (PyObject *)local_1a8) {
    operator_delete((void *)local_1b8._0_8_,(ulong)(local_1a8._0_8_ + 1));
  }
  if ((function_call *)local_d8._0_8_ != (function_call *)(local_d8 + 0x10)) {
    operator_delete((void *)local_d8._0_8_,(ulong)((long)(function_record **)local_d8._16_8_ + 1));
  }
  uVar24 = 0;
  do {
    __val = uVar24 + 1;
    __len = 1;
    if (8 < uVar24) {
      uVar23 = (ulong)__val;
      uVar24 = 4;
      do {
        __len = uVar24;
        uVar11 = (uint)uVar23;
        if (uVar11 < 100) {
          __len = __len - 2;
          goto LAB_0010ee74;
        }
        if (uVar11 < 1000) {
          __len = __len - 1;
          goto LAB_0010ee74;
        }
        if (uVar11 < 10000) goto LAB_0010ee74;
        uVar23 = uVar23 / 10000;
        uVar24 = __len + 4;
      } while (99999 < uVar11);
      __len = __len + 1;
    }
LAB_0010ee74:
    local_d8._0_8_ = local_d8 + 0x10;
    std::__cxx11::string::_M_construct((ulong)local_d8,(char)__len);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_d8._0_8_,__len,__val);
    puVar14 = (undefined8 *)std::__cxx11::string::replace((ulong)local_d8,0,(char *)0x0,0x1837ff);
    local_1b8._0_8_ = local_1a8;
    pfVar27 = (function_call *)(puVar14 + 2);
    if ((function_call *)*puVar14 == pfVar27) {
      local_1a8._0_8_ = ((PyObject *)&pfVar27->func)->ob_refcnt;
      local_1a8._8_8_ = puVar14[3];
    }
    else {
      local_1a8._0_8_ = ((PyObject *)&pfVar27->func)->ob_refcnt;
      local_1b8._0_8_ = (PyObject *)*puVar14;
    }
    local_1b8._8_8_ = puVar14[1];
    *puVar14 = pfVar27;
    puVar14[1] = 0;
    *(undefined1 *)(puVar14 + 2) = 0;
    puVar14 = (undefined8 *)std::__cxx11::string::append(local_1b8);
    local_1e8._0_8_ = local_1e8 + 0x10;
    pfVar27 = (function_call *)(puVar14 + 2);
    if ((function_call *)*puVar14 == pfVar27) {
      local_1e8._16_8_ = ((PyObject *)&pfVar27->func)->ob_refcnt;
      oStack_1d0.super_handle.m_ptr = (handle)puVar14[3];
    }
    else {
      local_1e8._16_8_ = ((PyObject *)&pfVar27->func)->ob_refcnt;
      local_1e8._0_8_ = (function_call *)*puVar14;
    }
    local_1e8._8_8_ = puVar14[1];
    *puVar14 = pfVar27;
    puVar14[1] = 0;
    *(undefined1 *)(puVar14 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_170,local_1e8._0_8_);
    if ((function_call *)local_1e8._0_8_ != (function_call *)(local_1e8 + 0x10)) {
      operator_delete((void *)local_1e8._0_8_,(ulong)(local_1e8._16_8_ + 1));
    }
    if ((function_call *)local_1b8._0_8_ != (function_call *)local_1a8) {
      operator_delete((void *)local_1b8._0_8_,(ulong)(local_1a8._0_8_ + 1));
    }
    if ((function_call *)local_d8._0_8_ != (function_call *)(local_d8 + 0x10)) {
      operator_delete((void *)local_d8._0_8_,(ulong)((long)(function_record **)local_d8._16_8_ + 1))
      ;
    }
    if ((*(byte *)((long)&local_108[1].field_1 + 0x11) & 1) == 0) {
LAB_0010f0fd:
      std::__cxx11::string::append((char *)local_170);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1e8,(char *)(piVar29->field_1).nonsimple.values_and_holders,
                 (allocator<char> *)local_1b8);
      lVar16 = std::__cxx11::string::find((char)(string *)local_1e8,0x28);
      pfVar27 = (function_call *)(lVar16 + 7);
      if ((ulong)local_1e8._8_8_ <= pfVar27) {
LAB_0010f0e1:
        if ((function_call *)local_1e8._0_8_ != (function_call *)(local_1e8 + 0x10)) {
          operator_delete((void *)local_1e8._0_8_,(ulong)(local_1e8._16_8_ + 1));
        }
        goto LAB_0010f0fd;
      }
      pfVar17 = (function_call *)std::__cxx11::string::find(local_1e8,0x1828c8,0);
      std::__cxx11::string::rfind(local_1e8,0x182d65,0xffffffffffffffff);
      if (pfVar17 < (ulong)local_1e8._8_8_) {
        pfVar18 = (function_call *)((long)&((PyObject *)&pfVar17->func)->ob_refcnt + 2);
      }
      else {
        pfVar18 = (function_call *)std::__cxx11::string::find((char)local_1e8,0x29);
        pfVar17 = pfVar18;
      }
      if ((pfVar17 <= pfVar27) || ((ulong)local_1e8._8_8_ <= pfVar18)) goto LAB_0010f0e1;
      std::__cxx11::string::append((string *)local_170,(ulong)local_1e8,(ulong)pfVar27);
      std::__cxx11::string::push_back((char)(string *)local_170);
      std::__cxx11::string::append((string *)local_170,(ulong)local_1e8,(ulong)pfVar18);
      if ((function_call *)local_1e8._0_8_ != (function_call *)(local_1e8 + 0x10)) {
        operator_delete((void *)local_1e8._0_8_,(ulong)(local_1e8._16_8_ + 1));
      }
    }
    std::__cxx11::string::append((char *)local_170);
    piVar29 = (instance *)piVar29[2].field_1.nonsimple.values_and_holders;
    uVar24 = __val;
  } while (piVar29 != (instance *)0x0);
  std::__cxx11::string::append(local_170);
  local_f8.m_ptr = (PyObject *)local_188;
  if (local_188 != (function_call *)0x0) {
    ((PyObject *)&local_188->func)->ob_refcnt = ((PyObject *)&local_188->func)->ob_refcnt + 1;
  }
  bVar31 = false;
  for (pfVar30 = (function_record *)(ulong)(*(ushort *)((long)&local_108[1].field_1 + 0x11) & 1);
      pfVar19 = (function_record *)PyTuple_Size(local_f8.m_ptr), pfVar30 < pfVar19;
      pfVar30 = (function_record *)((long)&((PyObject *)&pfVar30->name)->ob_refcnt + 1)) {
    bVar3 = true;
    if (bVar31) {
      std::__cxx11::string::append(local_170);
      bVar3 = bVar31;
    }
    bVar31 = bVar3;
    local_1b8._8_8_ = local_f8.m_ptr;
    local_1a8._8_8_ = (PyObject *)0x0;
    local_1a8._0_8_ = pfVar30;
    poVar20 = detail::accessor<pybind11::detail::accessor_policies::tuple_item>::get_cache
                        ((accessor<pybind11::detail::accessor_policies::tuple_item> *)local_1b8);
    local_100.m_ptr = (poVar20->super_handle).m_ptr;
    if ((function_call *)local_100.m_ptr != (function_call *)0x0) {
      ((PyObject *)&(local_100.m_ptr)->ob_refcnt)->ob_refcnt =
           ((PyObject *)&(local_100.m_ptr)->ob_refcnt)->ob_refcnt + 1;
    }
    hVar13.m_ptr = (PyObject *)PyObject_Repr(local_100.m_ptr);
    if ((function_call *)hVar13.m_ptr == (function_call *)0x0) {
      local_188 = (function_call *)__cxa_allocate_exception(0x28);
      error_already_set::error_already_set((error_already_set *)local_188);
      __cxa_throw(local_188,&error_already_set::typeinfo,error_already_set::~error_already_set);
    }
    local_d8._0_8_ = hVar13.m_ptr;
    str::operator_cast_to_string((string *)local_1e8,(str *)local_d8);
    std::__cxx11::string::_M_append(local_170,local_1e8._0_8_);
    if ((function_call *)local_1e8._0_8_ != (function_call *)(local_1e8 + 0x10)) {
      operator_delete((void *)local_1e8._0_8_,(ulong)(local_1e8._16_8_ + 1));
    }
    object::~object((object *)local_d8);
    object::~object((object *)&local_100);
    object::~object((object *)(local_1a8 + 8));
  }
  if (local_180 != (function_call *)0x0) {
    local_100.m_ptr = (PyObject *)local_180;
    ((PyObject *)&local_180->func)->ob_refcnt = ((PyObject *)&local_180->func)->ob_refcnt + 1;
    lVar16 = PyDict_Size();
    if (lVar16 != 0) {
      if (bVar31) {
        std::__cxx11::string::append(local_170);
      }
      std::__cxx11::string::append(local_170);
      local_1e8._0_8_ = local_100.m_ptr;
      local_1e8._8_8_ = (function_call *)0x0;
      local_1e8._16_8_ = (function_call *)0x0;
      oStack_1d0.super_handle.m_ptr = (handle)(PyObject *)0x0;
      iVar10 = PyDict_Next(local_100.m_ptr,local_1e8 + 0x18,local_1e8 + 8,local_1e8 + 0x10);
      if (iVar10 == 0) {
        oStack_1d0.super_handle.m_ptr = (handle)(PyObject *)0xffffffffffffffff;
      }
      if (oStack_1d0.super_handle.m_ptr != (PyObject *)0xffffffffffffffff) {
        bVar31 = true;
        do {
          local_d8._0_8_ = local_1e8._8_8_;
          local_d8._8_8_ = local_1e8._16_8_;
          if (bVar31) {
            bVar31 = false;
          }
          else {
            std::__cxx11::string::append(local_170);
          }
          str::str((str *)&local_48,"{}=");
          str::format<pybind11::handle&>((str *)&local_58,&local_48);
          str::operator_cast_to_string((string *)local_1b8,(str *)&local_58);
          std::__cxx11::string::_M_append(local_170,local_1b8._0_8_);
          if ((function_call *)local_1b8._0_8_ != (function_call *)local_1a8) {
            operator_delete((void *)local_1b8._0_8_,(ulong)(local_1a8._0_8_ + 1));
          }
          object::~object(&local_58);
          object::~object((object *)&local_48);
          hVar13.m_ptr = (PyObject *)PyObject_Repr(local_d8._8_8_);
          if (hVar13.m_ptr == (PyObject *)0x0) {
            local_188 = (function_call *)__cxa_allocate_exception(0x28);
            error_already_set::error_already_set((error_already_set *)local_188);
            __cxa_throw(local_188,&error_already_set::typeinfo,error_already_set::~error_already_set
                       );
          }
          local_58.super_handle.m_ptr = (handle)(handle)hVar13.m_ptr;
          str::operator_cast_to_string((string *)local_1b8,(str *)&local_58);
          std::__cxx11::string::_M_append(local_170,local_1b8._0_8_);
          if ((PyObject *)local_1b8._0_8_ != (PyObject *)local_1a8) {
            operator_delete((void *)local_1b8._0_8_,(ulong)(local_1a8._0_8_ + 1));
          }
          object::~object(&local_58);
          iVar10 = PyDict_Next(local_1e8._0_8_,local_1e8 + 0x18,local_1e8 + 8,local_1e8 + 0x10);
          if (iVar10 == 0) {
            oStack_1d0.super_handle.m_ptr = (handle)(PyObject *)0xffffffffffffffff;
          }
        } while (oStack_1d0.super_handle.m_ptr != (PyObject *)0xffffffffffffffff);
      }
    }
    object::~object((object *)&local_100);
  }
  lVar16 = std::__cxx11::string::find(local_170,0x182f96,0);
  if (lVar16 != -1) {
    std::__cxx11::string::append(local_170);
  }
  PyErr_SetString(_PyExc_TypeError,local_170);
  object::~object((object *)&local_f8);
  if (local_170 == (undefined1  [8])(auStack_168 + 8)) {
    return (PyObject *)0x0;
  }
LAB_0010f649:
  operator_delete((void *)local_170,(ulong)((long)(PyTypeObject **)auStack_168._8_8_ + 1));
  return (PyObject *)0x0;
}

Assistant:

static PyObject *dispatcher(PyObject *self, PyObject *args_in, PyObject *kwargs_in) {
        using namespace detail;

        /* Iterator over the list of potentially admissible overloads */
        const function_record *overloads = (function_record *) PyCapsule_GetPointer(self, nullptr),
                              *it = overloads;

        /* Need to know how many arguments + keyword arguments there are to pick the right overload */
        const auto n_args_in = (size_t) PyTuple_GET_SIZE(args_in);

        handle parent = n_args_in > 0 ? PyTuple_GET_ITEM(args_in, 0) : nullptr,
               result = PYBIND11_TRY_NEXT_OVERLOAD;

        auto self_value_and_holder = value_and_holder();
        if (overloads->is_constructor) {
            if (!PyObject_TypeCheck(parent.ptr(), (PyTypeObject *) overloads->scope.ptr())) {
                PyErr_SetString(PyExc_TypeError, "__init__(self, ...) called with invalid `self` argument");
                return nullptr;
            }

            const auto tinfo = get_type_info((PyTypeObject *) overloads->scope.ptr());
            const auto pi = reinterpret_cast<instance *>(parent.ptr());
            self_value_and_holder = pi->get_value_and_holder(tinfo, true);

            // If this value is already registered it must mean __init__ is invoked multiple times;
            // we really can't support that in C++, so just ignore the second __init__.
            if (self_value_and_holder.instance_registered())
                return none().release().ptr();
        }

        try {
            // We do this in two passes: in the first pass, we load arguments with `convert=false`;
            // in the second, we allow conversion (except for arguments with an explicit
            // py::arg().noconvert()).  This lets us prefer calls without conversion, with
            // conversion as a fallback.
            std::vector<function_call> second_pass;

            // However, if there are no overloads, we can just skip the no-convert pass entirely
            const bool overloaded = it != nullptr && it->next != nullptr;

            for (; it != nullptr; it = it->next) {

                /* For each overload:
                   1. Copy all positional arguments we were given, also checking to make sure that
                      named positional arguments weren't *also* specified via kwarg.
                   2. If we weren't given enough, try to make up the omitted ones by checking
                      whether they were provided by a kwarg matching the `py::arg("name")` name.  If
                      so, use it (and remove it from kwargs; if not, see if the function binding
                      provided a default that we can use.
                   3. Ensure that either all keyword arguments were "consumed", or that the function
                      takes a kwargs argument to accept unconsumed kwargs.
                   4. Any positional arguments still left get put into a tuple (for args), and any
                      leftover kwargs get put into a dict.
                   5. Pack everything into a vector; if we have py::args or py::kwargs, they are an
                      extra tuple or dict at the end of the positional arguments.
                   6. Call the function call dispatcher (function_record::impl)

                   If one of these fail, move on to the next overload and keep trying until we get a
                   result other than PYBIND11_TRY_NEXT_OVERLOAD.
                 */

                const function_record &func = *it;
                size_t num_args = func.nargs;    // Number of positional arguments that we need
                if (func.has_args) --num_args;   // (but don't count py::args
                if (func.has_kwargs) --num_args; //  or py::kwargs)
                size_t pos_args = num_args - func.nargs_kw_only;

                if (!func.has_args && n_args_in > pos_args)
                    continue; // Too many positional arguments for this overload

                if (n_args_in < pos_args && func.args.size() < pos_args)
                    continue; // Not enough positional arguments given, and not enough defaults to fill in the blanks

                function_call call(func, parent);

                size_t args_to_copy = (std::min)(pos_args, n_args_in); // Protect std::min with parentheses
                size_t args_copied = 0;

                // 0. Inject new-style `self` argument
                if (func.is_new_style_constructor) {
                    // The `value` may have been preallocated by an old-style `__init__`
                    // if it was a preceding candidate for overload resolution.
                    if (self_value_and_holder)
                        self_value_and_holder.type->dealloc(self_value_and_holder);

                    call.init_self = PyTuple_GET_ITEM(args_in, 0);
                    call.args.emplace_back(reinterpret_cast<PyObject *>(&self_value_and_holder));
                    call.args_convert.push_back(false);
                    ++args_copied;
                }

                // 1. Copy any position arguments given.
                bool bad_arg = false;
                for (; args_copied < args_to_copy; ++args_copied) {
                    const argument_record *arg_rec = args_copied < func.args.size() ? &func.args[args_copied] : nullptr;
                    if (kwargs_in && arg_rec && arg_rec->name && PyDict_GetItemString(kwargs_in, arg_rec->name)) {
                        bad_arg = true;
                        break;
                    }

                    handle arg(PyTuple_GET_ITEM(args_in, args_copied));
                    if (arg_rec && !arg_rec->none && arg.is_none()) {
                        bad_arg = true;
                        break;
                    }
                    call.args.push_back(arg);
                    call.args_convert.push_back(arg_rec ? arg_rec->convert : true);
                }
                if (bad_arg)
                    continue; // Maybe it was meant for another overload (issue #688)

                // We'll need to copy this if we steal some kwargs for defaults
                dict kwargs = reinterpret_borrow<dict>(kwargs_in);

                // 1.5. Fill in any missing pos_only args from defaults if they exist
                if (args_copied < func.nargs_pos_only) {
                    for (; args_copied < func.nargs_pos_only; ++args_copied) {
                        const auto &arg_rec = func.args[args_copied];
                        handle value;

                        if (arg_rec.value) {
                            value = arg_rec.value;
                        }
                        if (value) {
                            call.args.push_back(value);
                            call.args_convert.push_back(arg_rec.convert);
                        } else
                            break;
                    }

                    if (args_copied < func.nargs_pos_only)
                        continue; // Not enough defaults to fill the positional arguments
                }

                // 2. Check kwargs and, failing that, defaults that may help complete the list
                if (args_copied < num_args) {
                    bool copied_kwargs = false;

                    for (; args_copied < num_args; ++args_copied) {
                        const auto &arg_rec = func.args[args_copied];

                        handle value;
                        if (kwargs_in && arg_rec.name)
                            value = PyDict_GetItemString(kwargs.ptr(), arg_rec.name);

                        if (value) {
                            // Consume a kwargs value
                            if (!copied_kwargs) {
                                kwargs = reinterpret_steal<dict>(PyDict_Copy(kwargs.ptr()));
                                copied_kwargs = true;
                            }
                            PyDict_DelItemString(kwargs.ptr(), arg_rec.name);
                        } else if (arg_rec.value) {
                            value = arg_rec.value;
                        }

                        if (!arg_rec.none && value.is_none()) {
                            break;
                        }

                        if (value) {
                            call.args.push_back(value);
                            call.args_convert.push_back(arg_rec.convert);
                        }
                        else
                            break;
                    }

                    if (args_copied < num_args)
                        continue; // Not enough arguments, defaults, or kwargs to fill the positional arguments
                }

                // 3. Check everything was consumed (unless we have a kwargs arg)
                if (kwargs && !kwargs.empty() && !func.has_kwargs)
                    continue; // Unconsumed kwargs, but no py::kwargs argument to accept them

                // 4a. If we have a py::args argument, create a new tuple with leftovers
                if (func.has_args) {
                    tuple extra_args;
                    if (args_to_copy == 0) {
                        // We didn't copy out any position arguments from the args_in tuple, so we
                        // can reuse it directly without copying:
                        extra_args = reinterpret_borrow<tuple>(args_in);
                    } else if (args_copied >= n_args_in) {
                        extra_args = tuple(0);
                    } else {
                        size_t args_size = n_args_in - args_copied;
                        extra_args = tuple(args_size);
                        for (size_t i = 0; i < args_size; ++i) {
                            extra_args[i] = PyTuple_GET_ITEM(args_in, args_copied + i);
                        }
                    }
                    call.args.push_back(extra_args);
                    call.args_convert.push_back(false);
                    call.args_ref = std::move(extra_args);
                }

                // 4b. If we have a py::kwargs, pass on any remaining kwargs
                if (func.has_kwargs) {
                    if (!kwargs.ptr())
                        kwargs = dict(); // If we didn't get one, send an empty one
                    call.args.push_back(kwargs);
                    call.args_convert.push_back(false);
                    call.kwargs_ref = std::move(kwargs);
                }

                // 5. Put everything in a vector.  Not technically step 5, we've been building it
                // in `call.args` all along.
                #if !defined(NDEBUG)
                if (call.args.size() != func.nargs || call.args_convert.size() != func.nargs)
                    pybind11_fail("Internal error: function call dispatcher inserted wrong number of arguments!");
                #endif

                std::vector<bool> second_pass_convert;
                if (overloaded) {
                    // We're in the first no-convert pass, so swap out the conversion flags for a
                    // set of all-false flags.  If the call fails, we'll swap the flags back in for
                    // the conversion-allowed call below.
                    second_pass_convert.resize(func.nargs, false);
                    call.args_convert.swap(second_pass_convert);
                }

                // 6. Call the function.
                try {
                    loader_life_support guard{};
                    result = func.impl(call);
                } catch (reference_cast_error &) {
                    result = PYBIND11_TRY_NEXT_OVERLOAD;
                }

                if (result.ptr() != PYBIND11_TRY_NEXT_OVERLOAD)
                    break;

                if (overloaded) {
                    // The (overloaded) call failed; if the call has at least one argument that
                    // permits conversion (i.e. it hasn't been explicitly specified `.noconvert()`)
                    // then add this call to the list of second pass overloads to try.
                    for (size_t i = func.is_method ? 1 : 0; i < pos_args; i++) {
                        if (second_pass_convert[i]) {
                            // Found one: swap the converting flags back in and store the call for
                            // the second pass.
                            call.args_convert.swap(second_pass_convert);
                            second_pass.push_back(std::move(call));
                            break;
                        }
                    }
                }
            }

            if (overloaded && !second_pass.empty() && result.ptr() == PYBIND11_TRY_NEXT_OVERLOAD) {
                // The no-conversion pass finished without success, try again with conversion allowed
                for (auto &call : second_pass) {
                    try {
                        loader_life_support guard{};
                        result = call.func.impl(call);
                    } catch (reference_cast_error &) {
                        result = PYBIND11_TRY_NEXT_OVERLOAD;
                    }

                    if (result.ptr() != PYBIND11_TRY_NEXT_OVERLOAD) {
                        // The error reporting logic below expects 'it' to be valid, as it would be
                        // if we'd encountered this failure in the first-pass loop.
                        if (!result)
                            it = &call.func;
                        break;
                    }
                }
            }
        } catch (error_already_set &e) {
            e.restore();
            return nullptr;
#ifdef __GLIBCXX__
        } catch ( abi::__forced_unwind& ) {
            throw;
#endif
        } catch (...) {
            /* When an exception is caught, give each registered exception
               translator a chance to translate it to a Python exception
               in reverse order of registration.

               A translator may choose to do one of the following:

                - catch the exception and call PyErr_SetString or PyErr_SetObject
                  to set a standard (or custom) Python exception, or
                - do nothing and let the exception fall through to the next translator, or
                - delegate translation to the next translator by throwing a new type of exception. */

            auto last_exception = std::current_exception();
            auto &registered_exception_translators = get_internals().registered_exception_translators;
            for (auto& translator : registered_exception_translators) {
                try {
                    translator(last_exception);
                } catch (...) {
                    last_exception = std::current_exception();
                    continue;
                }
                return nullptr;
            }
            PyErr_SetString(PyExc_SystemError, "Exception escaped from default exception translator!");
            return nullptr;
        }

        auto append_note_if_missing_header_is_suspected = [](std::string &msg) {
            if (msg.find("std::") != std::string::npos) {
                msg += "\n\n"
                       "Did you forget to `#include <pybind11/stl.h>`? Or <pybind11/complex.h>,\n"
                       "<pybind11/functional.h>, <pybind11/chrono.h>, etc. Some automatic\n"
                       "conversions are optional and require extra headers to be included\n"
                       "when compiling your pybind11 module.";
            }
        };

        if (result.ptr() == PYBIND11_TRY_NEXT_OVERLOAD) {
            if (overloads->is_operator)
                return handle(Py_NotImplemented).inc_ref().ptr();

            std::string msg = std::string(overloads->name) + "(): incompatible " +
                std::string(overloads->is_constructor ? "constructor" : "function") +
                " arguments. The following argument types are supported:\n";

            int ctr = 0;
            for (const function_record *it2 = overloads; it2 != nullptr; it2 = it2->next) {
                msg += "    "+ std::to_string(++ctr) + ". ";

                bool wrote_sig = false;
                if (overloads->is_constructor) {
                    // For a constructor, rewrite `(self: Object, arg0, ...) -> NoneType` as `Object(arg0, ...)`
                    std::string sig = it2->signature;
                    size_t start = sig.find('(') + 7; // skip "(self: "
                    if (start < sig.size()) {
                        // End at the , for the next argument
                        size_t end = sig.find(", "), next = end + 2;
                        size_t ret = sig.rfind(" -> ");
                        // Or the ), if there is no comma:
                        if (end >= sig.size()) next = end = sig.find(')');
                        if (start < end && next < sig.size()) {
                            msg.append(sig, start, end - start);
                            msg += '(';
                            msg.append(sig, next, ret - next);
                            wrote_sig = true;
                        }
                    }
                }
                if (!wrote_sig) msg += it2->signature;

                msg += "\n";
            }
            msg += "\nInvoked with: ";
            auto args_ = reinterpret_borrow<tuple>(args_in);
            bool some_args = false;
            for (size_t ti = overloads->is_constructor ? 1 : 0; ti < args_.size(); ++ti) {
                if (!some_args) some_args = true;
                else msg += ", ";
                try {
                    msg += pybind11::repr(args_[ti]);
                } catch (const error_already_set&) {
                    msg += "<repr raised Error>";
                }
            }
            if (kwargs_in) {
                auto kwargs = reinterpret_borrow<dict>(kwargs_in);
                if (!kwargs.empty()) {
                    if (some_args) msg += "; ";
                    msg += "kwargs: ";
                    bool first = true;
                    for (auto kwarg : kwargs) {
                        if (first) first = false;
                        else msg += ", ";
                        msg += pybind11::str("{}=").format(kwarg.first);
                        try {
                            msg += pybind11::repr(kwarg.second);
                        } catch (const error_already_set&) {
                            msg += "<repr raised Error>";
                        }
                    }
                }
            }

            append_note_if_missing_header_is_suspected(msg);
            PyErr_SetString(PyExc_TypeError, msg.c_str());
            return nullptr;
        } else if (!result) {
            std::string msg = "Unable to convert function return value to a "
                              "Python type! The signature was\n\t";
            msg += it->signature;
            append_note_if_missing_header_is_suspected(msg);
            PyErr_SetString(PyExc_TypeError, msg.c_str());
            return nullptr;
        } else {
            if (overloads->is_constructor && !self_value_and_holder.holder_constructed()) {
                auto *pi = reinterpret_cast<instance *>(parent.ptr());
                self_value_and_holder.type->init_instance(pi, nullptr);
            }
            return result.ptr();
        }
    }